

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
::
emplace_decomposable<char,std::piecewise_construct_t_const&,std::tuple<char_const&>,std::tuple<char_const&>>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::FlatHashMapPolicy<char,char>,phmap::Hash<char>,phmap::EqualTo<char>,std::allocator<std::pair<char_const,char>>>
          *this,char *key,size_t hashval,piecewise_construct_t *args,tuple<const_char_&> *args_1,
          tuple<const_char_&> *args_2)

{
  long lVar1;
  char *pcVar2;
  size_t i;
  pair<unsigned_long,_bool> pVar3;
  
  pVar3 = raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
          ::find_or_prepare_insert<char>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                      *)this,key,hashval);
  i = pVar3.first;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar1 = *(long *)(this + 8);
    pcVar2 = (args_2->super__Tuple_impl<0UL,_const_char_&>).
             super__Head_base<0UL,_const_char_&,_false>._M_head_impl;
    *(char *)(lVar1 + i * 2) =
         *(args_1->super__Tuple_impl<0UL,_const_char_&>).super__Head_base<0UL,_const_char_&,_false>.
          _M_head_impl;
    *(char *)(lVar1 + 1 + i * 2) = *pcVar2;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashMapPolicy<char,_char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<std::pair<const_char,_char>_>_>
                *)this,i,(byte)hashval & 0x7f);
  }
  lVar1 = *(long *)(this + 8);
  (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)this + i);
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 2 + lVar1);
  __return_storage_ptr__->second = pVar3.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval,
			        Args&&... args)
			{
				auto res = find_or_prepare_insert(key, hashval);
				if (res.second) {
					emplace_at(res.first, std::forward<Args>(args)...);
					this->set_ctrl(res.first, H2(hashval));
				}
				return {iterator_at(res.first), res.second};
			}